

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeSetAutoVacuum(Btree *p,int autoVacuum)

{
  BtShared *pBVar1;
  char cVar2;
  int local_24;
  u8 av;
  int rc;
  BtShared *pBt;
  int autoVacuum_local;
  Btree *p_local;
  
  pBVar1 = p->pBt;
  local_24 = 0;
  cVar2 = (char)autoVacuum;
  sqlite3BtreeEnter(p);
  if (((pBVar1->btsFlags & 2) == 0) || ((cVar2 != '\0') == (bool)pBVar1->autoVacuum)) {
    pBVar1->autoVacuum = cVar2 != '\0';
    pBVar1->incrVacuum = cVar2 == '\x02';
  }
  else {
    local_24 = 8;
  }
  sqlite3BtreeLeave(p);
  return local_24;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetAutoVacuum(Btree *p, int autoVacuum){
#ifdef SQLITE_OMIT_AUTOVACUUM
  return SQLITE_READONLY;
#else
  BtShared *pBt = p->pBt;
  int rc = SQLITE_OK;
  u8 av = (u8)autoVacuum;

  sqlite3BtreeEnter(p);
  if( (pBt->btsFlags & BTS_PAGESIZE_FIXED)!=0 && (av ?1:0)!=pBt->autoVacuum ){
    rc = SQLITE_READONLY;
  }else{
    pBt->autoVacuum = av ?1:0;
    pBt->incrVacuum = av==2 ?1:0;
  }
  sqlite3BtreeLeave(p);
  return rc;
#endif
}